

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubFodderBuilders.cpp
# Opt level: O3

void __thiscall SubFodderBuilderB::addIngredientA(SubFodderBuilderB *this)

{
  Fodder *this_00;
  string local_40;
  
  this_00 = this->_fodder;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"BA","");
  Fodder::setIngredientA(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SubFodderBuilderB::addIngredientA() {
	// add something
	_fodder->setIngredientA("BA");
}